

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O3

int __thiscall
duckdb::GetBitOperator::Operation<duckdb::string_t,int,int>
          (GetBitOperator *this,string_t input,int n)

{
  int iVar1;
  long lVar2;
  OutOfRangeException *this_00;
  uint value;
  undefined8 extraout_RDX;
  string_t sVar3;
  string_t sVar4;
  string local_88;
  string local_68;
  string local_48;
  
  sVar4.value._8_8_ = input.value._0_8_;
  value = input.value._8_4_;
  if (-1 < (int)value) {
    lVar2 = duckdb::Bit::BitLength((Bit *)this,input);
    if ((ulong)value <= lVar2 - 1U) {
      sVar4.value._0_8_ = this;
      iVar1 = duckdb::Bit::GetBit(sVar4,(ulong)value);
      return iVar1;
    }
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"bit index %s out of valid range (0..%s)","");
  NumericHelper::ToString<int>(&local_48,value);
  sVar3.value.pointer.ptr = (char *)extraout_RDX;
  sVar3.value._0_8_ = sVar4.value._8_8_;
  lVar2 = duckdb::Bit::BitLength((Bit *)this,sVar3);
  NumericHelper::ToString<unsigned_long>(&local_68,lVar2 - 1);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_88,&local_48,&local_68);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB n) {
		if (n < 0 || (idx_t)n > Bit::BitLength(input) - 1) {
			throw OutOfRangeException("bit index %s out of valid range (0..%s)", NumericHelper::ToString(n),
			                          NumericHelper::ToString(Bit::BitLength(input) - 1));
		}
		return UnsafeNumericCast<TR>(Bit::GetBit(input, UnsafeNumericCast<idx_t>(n)));
	}